

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rotation.cpp
# Opt level: O0

Matrix3x3 * iDynTree::Rotation::leftJacobianInverse(AngularMotionVector3 *omega)

{
  bool bVar1;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_> *in_RDI;
  Matrix3x3 phi_cross;
  Vector3 phi;
  double alpha3;
  double alpha2;
  double alpha1;
  double cot;
  double s;
  double c;
  double normovertwo;
  double norm;
  IdentityReturnType I3;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>_>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_0>_>_>
  *in_stack_fffffffffffffbe8;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_> *this;
  MatrixBase<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_fffffffffffffc00;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_fffffffffffffc08;
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_0>_>
  *in_stack_fffffffffffffc10;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>_>_>
  *in_stack_fffffffffffffc18;
  StorageBaseType *in_stack_fffffffffffffc30;
  double *in_stack_fffffffffffffc38;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffd18;
  MatrixFixSize<3U,_3U> local_118;
  VectorFixSize<3U> local_a0;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_40 [3];
  double local_28 [5];
  
  this = in_RDI;
  MatrixFixSize<3U,_3U>::MatrixFixSize((MatrixFixSize<3U,_3U> *)in_RDI);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity
            ((Index)in_stack_fffffffffffffc18,(Index)in_stack_fffffffffffffc10);
  toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffffc08);
  local_28[0] = Eigen::
                MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                ::norm((MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                        *)in_stack_fffffffffffffbe8);
  local_40[0] = 0.0;
  bVar1 = checkDoublesAreEqual(local_28,local_40,DEFAULT_TOL);
  if (bVar1) {
    toEigen<3u,3u>((MatrixFixSize<3U,_3U> *)in_stack_fffffffffffffc08);
    Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>::operator=
              ((Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)in_RDI,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)in_stack_fffffffffffffbe8);
  }
  else {
    local_58 = local_28[0] / 2.0;
    local_60 = cos(local_58);
    local_68 = sin(local_58);
    local_70 = local_60 / local_68;
    local_78 = local_58 * local_70;
    local_80 = -local_58;
    local_88 = 1.0 - local_78;
    VectorFixSize<3U>::VectorFixSize(&local_a0);
    toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffffc08);
    toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffffc08);
    Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
              ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)in_RDI,
               (DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                *)in_stack_fffffffffffffbe8);
    toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffffc08);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>::
    normalize(this);
    MatrixFixSize<3U,_3U>::MatrixFixSize(&local_118);
    toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffffc08);
    skew<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              (in_stack_fffffffffffffd18);
    toEigen<3u,3u>((MatrixFixSize<3U,_3U> *)in_stack_fffffffffffffc08);
    Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>::operator=
              ((Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)in_RDI,
               (DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)in_stack_fffffffffffffbe8);
    Eigen::operator*(in_stack_fffffffffffffc38,(StorageBaseType *)in_stack_fffffffffffffc30);
    toEigen<3u,3u>((MatrixFixSize<3U,_3U> *)in_stack_fffffffffffffc08);
    Eigen::operator*(in_stack_fffffffffffffc38,(StorageBaseType *)in_stack_fffffffffffffc30);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>>const>>
    ::operator+((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                 *)in_stack_fffffffffffffc18,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>_>
                 *)in_stack_fffffffffffffc10);
    toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffffc08);
    Eigen::operator*(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
    toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffffc08);
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>::
    transpose((DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
               *)this);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const>>
    ::operator*(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>const>const>>
    ::operator+(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
    toEigen<3u,3u>((MatrixFixSize<3U,_3U> *)in_stack_fffffffffffffc08);
    Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>::operator=
              ((Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)in_RDI,
               in_stack_fffffffffffffbe8);
  }
  return (Matrix3x3 *)this;
}

Assistant:

Matrix3x3 Rotation::leftJacobianInverse(const AngularMotionVector3& omega)
    {
        iDynTree::Matrix3x3 Jinv;
        auto I3 = Eigen::MatrixXd::Identity(3, 3);
        using iDynTree::toEigen;
        double norm = toEigen(omega).norm();

        if (iDynTree::checkDoublesAreEqual(norm, 0.0))
        {
            toEigen(Jinv) = I3;
            return Jinv;
        }

        double normovertwo{norm/2.0};
        double c{std::cos(normovertwo)};
        double s{std::sin(normovertwo)};
        double cot{c/s};

        double alpha1{(normovertwo*cot)};
        double alpha2{(-normovertwo)};
        double alpha3{(1 - alpha1)};

        Vector3 phi;
        toEigen(phi) = toEigen(omega);
        toEigen(phi).normalize();

        Matrix3x3 phi_cross;
        toEigen(phi_cross) = skew(toEigen(phi));

        toEigen(Jinv) = alpha1*I3  + alpha2*toEigen(phi_cross) + alpha3*toEigen(phi)*toEigen(phi).transpose();
        return Jinv;
    }